

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O1

void aeron::defaultErrorHandler(exception *exception)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
  __s = (char *)(**(code **)(*(long *)exception + 0x10))(exception);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x166540);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
  }
  lVar2 = __dynamic_cast(exception,&std::exception::typeinfo,&util::SourcedException::typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," : ",3);
  std::operator<<((ostream *)&std::cerr,*(char **)(lVar2 + 8));
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(-1);
}

Assistant:

inline void defaultErrorHandler(const std::exception& exception)
{
    std::cerr << "ERROR: " << exception.what();

    try
    {
        const SourcedException& sourcedException = dynamic_cast<const SourcedException&>(exception);
        std::cerr << " : " << sourcedException.where();
    }
    catch (const std::bad_cast&)
    {
        // ignore
    }

    std::cerr << std::endl;
    ::exit(-1);
}